

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O1

int cmac_multiply_by_u(uchar *output,uchar *input,size_t blocksize)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  
  if (blocksize == 0x10) {
    bVar1 = 0x87;
  }
  else {
    if (blocksize != 8) {
      return -0x6100;
    }
    bVar1 = 0x1b;
  }
  if (0 < (long)blocksize) {
    uVar2 = (ulong)((int)blocksize - 1);
    iVar3 = (int)blocksize + 1;
    bVar4 = 0;
    do {
      output[uVar2] = input[uVar2] * '\x02' | bVar4;
      bVar4 = input[uVar2] >> 7;
      uVar2 = uVar2 - 1;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  output[blocksize - 1] = output[blocksize - 1] ^ (char)*input >> 7 & bVar1;
  return 0;
}

Assistant:

static int cmac_multiply_by_u(unsigned char *output,
                              const unsigned char *input,
                              size_t blocksize)
{
    const unsigned char R_128 = 0x87;
    const unsigned char R_64 = 0x1B;
    unsigned char R_n, mask;
    unsigned char overflow = 0x00;
    int i;

    if (blocksize == MBEDTLS_AES_BLOCK_SIZE) {
        R_n = R_128;
    } else if (blocksize == MBEDTLS_DES3_BLOCK_SIZE) {
        R_n = R_64;
    } else {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    for (i = (int) blocksize - 1; i >= 0; i--) {
        output[i] = input[i] << 1 | overflow;
        overflow = input[i] >> 7;
    }

    /* mask = ( input[0] >> 7 ) ? 0xff : 0x00
     * using bit operations to avoid branches */

    /* MSVC has a warning about unary minus on unsigned, but this is
     * well-defined and precisely what we want to do here */
#if defined(_MSC_VER)
#pragma warning( push )
#pragma warning( disable : 4146 )
#endif
    mask = -(input[0] >> 7);
#if defined(_MSC_VER)
#pragma warning( pop )
#endif

    output[blocksize - 1] ^= R_n & mask;

    return 0;
}